

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O1

void parseArgs(int argc,char **argv,uint *textures,uint *start,string *output,uint *resolution,
              string *type)

{
  char *pcVar1;
  char *pcVar2;
  string *psVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  string local_70;
  uint *local_50;
  string *local_48;
  uint *local_40;
  uint *local_38;
  
  local_50 = resolution;
  local_48 = output;
  local_40 = start;
  local_38 = textures;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar4 = getopt(argc,argv,"d: t: n: s: i: r:");
        psVar3 = local_48;
        pcVar2 = _optarg;
        if (iVar4 < 0x6e) break;
        if (iVar4 == 0x6e) {
          uVar5 = atoi(_optarg);
          *local_38 = uVar5;
        }
        else if (iVar4 == 0x72) {
          uVar5 = atoi(_optarg);
          *local_50 = uVar5;
        }
        else {
          if (iVar4 != 0x74) goto LAB_0010528d;
          pcVar1 = (char *)type->_M_string_length;
          strlen(_optarg);
          std::__cxx11::string::_M_replace((ulong)type,0,pcVar1,(ulong)pcVar2);
        }
      }
      if (iVar4 != 100) break;
      pcVar1 = (char *)local_48->_M_string_length;
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)psVar3,0,pcVar1,(ulong)pcVar2);
    }
    if (iVar4 != 0x69) break;
    uVar5 = atoi(_optarg);
    *local_40 = uVar5;
  }
  if (iVar4 == -1) {
    return;
  }
LAB_0010528d:
  getUsage_abi_cxx11_(&local_70,*argv);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&local_70);
  exit(1);
}

Assistant:

void parseArgs(
    int argc,
    char** argv,
    unsigned int & textures,
    unsigned int & start,
    std::string & output,
    unsigned int & resolution,
    std::string & type)
{
    int opt;
    bool d, t, i, s, r;

    while ( (opt = getopt(argc,argv,"d: t: n: s: i: r:")) != EOF)
    {
        switch (opt)
        {
            case 'd':
                d=true; output = optarg; break;
            case 't':
                t=true; type = optarg; break;
            case 'n':
                s=true; textures = atoi(optarg); break;
            case 'i':
                i=true; start = atoi(optarg); break;
            case 'r':
                r=true; resolution = atoi(optarg); break;
            default:
                std::cout << getUsage(argv[0]) << std::endl;
                exit(EXIT_FAILURE);
        }
    }

    // If arg was not set then assign default values
    if (!s) textures    = ARG_TEXTURES_DEFAULT;
    if (!d) output      = ARG_OUTPUT_DIR_DEFAULT;
    if (!r) resolution  = ARG_IMG_RESOLUTION_DEFAULT;
    if (!i) start       = ARG_START_DEFAULT;
    if (!t) type        = ARG_TYPE_DEFAULT;
}